

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildExtensionRange
          (DescriptorBuilder *this,ExtensionRange *proto,Descriptor *parent,ExtensionRange *result)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_49;
  string local_48;
  
  iVar2 = proto->start_;
  result->start = iVar2;
  iVar3 = proto->end_;
  result->end = iVar3;
  if (iVar2 < 1) {
    psVar1 = *(string **)(parent + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Extension numbers must be positive integers.",&local_49);
    AddError(this,psVar1,&proto->super_Message,NUMBER,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = result->start;
    iVar3 = result->end;
  }
  if (iVar3 <= iVar2) {
    psVar1 = *(string **)(parent + 8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Extension range end number must be greater than start number.",
               &local_49);
    AddError(this,psVar1,&proto->super_Message,NUMBER,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildExtensionRange(
    const DescriptorProto::ExtensionRange& proto,
    const Descriptor* parent,
    Descriptor::ExtensionRange* result) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension numbers must be positive integers.");
  }

  // Checking of the upper bound of the extension range is deferred until after
  // options interpreting. This allows messages with message_set_wire_format to
  // have extensions beyond FieldDescriptor::kMaxNumber, since the extension
  // numbers are actually used as int32s in the message_set_wire_format.

  if (result->start >= result->end) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension range end number must be greater than start number.");
  }
}